

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void pnga_step_bound_info_patch
               (Integer g_xx,Integer *xxlo,Integer *xxhi,Integer g_vv,Integer *vvlo,Integer *vvhi,
               Integer g_xxll,Integer *xxlllo,Integer *xxllhi,Integer g_xxuu,Integer *xxuulo,
               Integer *xxuuhi,void *boundmin,void *wolfemin,void *boundmax)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  logical lVar6;
  Integer IVar7;
  void *in_RCX;
  Integer *in_RDX;
  Integer unaff_RBX;
  Integer *in_RSI;
  Integer in_RDI;
  Integer *in_R8;
  Integer *in_R9;
  Integer *in_stack_00000010;
  Integer *in_stack_00000018;
  Integer *in_stack_00000028;
  Integer *in_stack_00000030;
  float *in_stack_00000038;
  float *in_stack_00000040;
  float *in_stack_00000048;
  int i;
  int local_sync_end;
  int local_sync_begin;
  void *beta;
  void *alpha;
  void *sresult2;
  void *sresult;
  Integer compatible3;
  Integer compatible2;
  Integer compatible;
  float fresult2;
  float fresult;
  int iresult2;
  int iresult;
  float fbeta;
  float falpha;
  int ibeta;
  int ialpha;
  long lbeta;
  long lalpha;
  double dbeta;
  double dalpha;
  Integer g_T;
  Integer g_S;
  Integer g_R;
  Integer g_Q;
  Integer me;
  Integer xutotal;
  Integer xltotal;
  Integer hiXU [7];
  Integer loXU [7];
  Integer xudims [7];
  Integer xundim;
  Integer xutype;
  Integer hiXL [7];
  Integer loXL [7];
  Integer xldims [7];
  Integer xlndim;
  Integer xltype;
  Integer vvtotal;
  Integer xxtotal;
  Integer hiVV [7];
  Integer loVV [7];
  Integer vvdims [7];
  Integer vvndim;
  Integer vvtype;
  Integer hiXX [7];
  Integer loXX [7];
  Integer xxdims [7];
  Integer xxndim;
  Integer xxtype;
  Integer index [7];
  long lresult2;
  long lresult;
  double dresult2;
  double dresult;
  Integer in_stack_000007f0;
  void *in_stack_000007f8;
  Integer *in_stack_00000800;
  Integer *in_stack_00000808;
  Integer in_stack_00000810;
  void *in_stack_00000818;
  Integer *in_stack_00000830;
  Integer *in_stack_00000838;
  Integer in_stack_00000840;
  Integer *in_stack_00000848;
  Integer *in_stack_00000850;
  char *in_stack_fffffffffffffab8;
  Integer in_stack_fffffffffffffac0;
  void *in_stack_fffffffffffffac8;
  Integer *in_stack_fffffffffffffad0;
  Integer in_stack_fffffffffffffad8;
  Integer *in_stack_fffffffffffffae0;
  Integer *in_stack_fffffffffffffae8;
  Integer *in_stack_fffffffffffffaf0;
  Integer *local_508;
  float in_stack_fffffffffffffb00;
  float in_stack_fffffffffffffb04;
  float in_stack_fffffffffffffb08;
  float in_stack_fffffffffffffb0c;
  Integer *in_stack_fffffffffffffb10;
  Integer *local_4e8;
  Integer *local_4e0;
  Integer *local_4d8;
  float in_stack_fffffffffffffb30;
  float in_stack_fffffffffffffb34;
  float local_4c4;
  int local_4a4;
  float local_460;
  float local_45c;
  float local_458;
  float local_454;
  Integer g_a;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  Integer *local_3f8;
  Integer *local_3f0;
  Integer local_3e8 [6];
  Integer in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  Integer local_3a8 [3];
  Integer in_stack_fffffffffffffc70;
  Integer in_stack_fffffffffffffc78;
  Integer in_stack_fffffffffffffc80;
  long local_368 [2];
  char *in_stack_fffffffffffffca8;
  Integer in_stack_fffffffffffffcb0;
  Integer *in_stack_fffffffffffffcb8;
  Integer *in_stack_fffffffffffffcc0;
  Integer *in_stack_fffffffffffffcc8;
  Integer in_stack_fffffffffffffcd0;
  long local_328;
  long local_320;
  Integer local_318 [8];
  char *in_stack_fffffffffffffd28;
  Integer *in_stack_fffffffffffffd30;
  Integer in_stack_fffffffffffffd38;
  long local_298 [8];
  long local_258;
  long local_250;
  Integer *pIVar8;
  Integer *pIVar9;
  Integer in_stack_fffffffffffffdc8;
  Integer in_stack_fffffffffffffdd0;
  Integer local_1f8 [8];
  long local_1b8 [8];
  long local_178;
  long local_170;
  Integer local_168 [8];
  Integer local_128 [8];
  long local_e8 [5];
  Integer *in_stack_ffffffffffffff40;
  Integer *in_stack_ffffffffffffff48;
  Integer in_stack_ffffffffffffff50;
  long local_a8;
  long local_a0;
  Integer *local_60;
  Integer *local_58;
  Integer *local_50;
  Integer *local_48;
  
  pnga_nodeid();
  iVar5 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  g_a = -0x4010000000000000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar4 != 0) {
    pnga_sync();
  }
  pnga_check_handle(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  pnga_check_handle(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  pnga_check_handle(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  pnga_check_handle(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  pnga_inquire(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
  pnga_inquire(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
  pnga_inquire(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
  pnga_inquire(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
  if (local_a0 != local_170) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  if (local_a0 != local_250) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  if (local_a0 != local_320) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  for (local_4a4 = 0; local_4a4 < local_a8; local_4a4 = local_4a4 + 1) {
    if ((in_RSI[local_4a4] < 1) || (local_e8[local_4a4] < in_RDX[local_4a4])) {
      pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
  }
  for (local_4a4 = 0; local_4a4 < local_178; local_4a4 = local_4a4 + 1) {
    if ((in_R8[local_4a4] < 1) || (local_1b8[local_4a4] < in_R9[local_4a4])) {
      pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
  }
  for (local_4a4 = 0; local_4a4 < local_258; local_4a4 = local_4a4 + 1) {
    if ((in_stack_00000010[local_4a4] < 1) || (local_298[local_4a4] < in_stack_00000018[local_4a4]))
    {
      pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
  }
  for (local_4a4 = 0; local_4a4 < local_328; local_4a4 = local_4a4 + 1) {
    if ((in_stack_00000028[local_4a4] < 1) || (local_368[local_4a4] < in_stack_00000030[local_4a4]))
    {
      pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
  }
  pIVar9 = (Integer *)0x1;
  for (local_4a4 = 0; local_4a4 < local_a8; local_4a4 = local_4a4 + 1) {
    pIVar9 = (Integer *)(((in_RDX[local_4a4] - in_RSI[local_4a4]) + 1) * (long)pIVar9);
  }
  pIVar8 = (Integer *)0x1;
  for (local_4a4 = 0; local_4a4 < local_178; local_4a4 = local_4a4 + 1) {
    pIVar8 = (Integer *)(((in_R9[local_4a4] - in_R8[local_4a4]) + 1) * (long)pIVar8);
  }
  local_3f0 = (Integer *)0x1;
  for (local_4a4 = 0; local_4a4 < local_258; local_4a4 = local_4a4 + 1) {
    local_3f0 = (Integer *)
                (((in_stack_00000018[local_4a4] - in_stack_00000010[local_4a4]) + 1) *
                (long)local_3f0);
  }
  local_3f8 = (Integer *)0x1;
  for (local_4a4 = 0; local_4a4 < local_328; local_4a4 = local_4a4 + 1) {
    local_3f8 = (Integer *)
                (((in_stack_00000030[local_4a4] - in_stack_00000028[local_4a4]) + 1) *
                (long)local_3f8);
  }
  if (pIVar9 != pIVar8) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  if (pIVar9 != local_3f0) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  if (pIVar9 != local_3f8) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_distribution(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,pIVar9,pIVar8);
  pnga_distribution(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,pIVar9,pIVar8);
  pnga_distribution(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,pIVar9,pIVar8);
  pnga_distribution(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,pIVar9,pIVar8);
  lVar6 = pnga_comp_patch(local_a8,local_128,local_168,local_178,local_1f8,
                          (Integer *)&stack0xfffffffffffffdc8);
  if ((lVar6 == 0) ||
     (lVar6 = pnga_comp_patch(local_a8,in_RSI,in_RDX,local_178,in_R8,in_R9), lVar6 == 0)) {
    bVar3 = 0;
  }
  else {
    bVar3 = 1;
  }
  lVar6 = pnga_comp_patch(local_a8,local_128,local_168,local_258,(Integer *)&stack0xfffffffffffffd28
                          ,local_318);
  if ((lVar6 == 0) ||
     (lVar6 = pnga_comp_patch(local_a8,in_RSI,in_RDX,local_258,in_stack_00000010,in_stack_00000018),
     lVar6 == 0)) {
    bVar2 = 0;
  }
  else {
    bVar2 = 1;
  }
  lVar6 = pnga_comp_patch(local_a8,local_128,local_168,local_328,local_3a8,local_3e8);
  if ((lVar6 == 0) ||
     (lVar6 = pnga_comp_patch(local_a8,in_RSI,in_RDX,local_328,in_stack_00000028,in_stack_00000030),
     lVar6 == 0)) {
    bVar1 = 0;
  }
  else {
    bVar1 = 1;
  }
  pnga_type_f2c(0x3f2);
  pnga_gop((Integer)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
           in_stack_fffffffffffffab8);
  if (!(bool)(bVar3 & bVar2 & bVar1)) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  switch(local_a0) {
  case 0x3e9:
    break;
  case 0x3ea:
    break;
  case 0x3eb:
    break;
  case 0x3ec:
    break;
  default:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    break;
  case 0x3ee:
  case 0x3ef:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_duplicate(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if (local_408 == 0) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_duplicate(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if (local_410 == 0) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_duplicate(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if (local_418 == 0) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_duplicate(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if (local_420 == 0) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pIVar9 = in_RDX;
  pnga_add_patch(in_stack_00000818,in_stack_00000810,in_stack_00000808,in_stack_00000800,
                 in_stack_000007f8,in_stack_000007f0,in_stack_00000830,in_stack_00000838,
                 in_stack_00000840,in_stack_00000848,in_stack_00000850);
  IVar7 = has_negative_elem(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff40);
  if (IVar7 == 1) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_zero(g_a);
  pnga_elem_maximum(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  pnga_elem_stepb_divide_patch
            ((Integer)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
             in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,in_RDX,
             CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             (Integer *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             in_stack_fffffffffffffb10);
  pnga_select_elem((Integer)in_RSI,(char *)pIVar9,in_RCX,in_R8);
  switch(local_a0) {
  case 0x3e9:
    break;
  case 0x3ea:
    break;
  case 0x3eb:
    break;
  case 0x3ec:
    break;
  default:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    break;
  case 0x3ee:
  case 0x3ef:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pIVar8 = pIVar9;
  pnga_add_patch(in_stack_00000818,in_stack_00000810,in_stack_00000808,in_stack_00000800,
                 in_stack_000007f8,in_stack_000007f0,in_stack_00000830,in_stack_00000838,
                 in_stack_00000840,in_stack_00000848,in_stack_00000850);
  IVar7 = has_negative_elem(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                            in_stack_ffffffffffffff40);
  if (IVar7 == 1) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_zero(g_a);
  pnga_elem_minimum(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  pnga_abs_value(CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  pnga_elem_stepb_divide_patch
            ((Integer)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
             in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,pIVar9,
             CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             (Integer *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             in_stack_fffffffffffffb10);
  pnga_select_elem((Integer)in_RSI,(char *)pIVar8,in_RCX,in_R8);
  switch(local_a0) {
  case 0x3e9:
    if ((int)local_458 < (int)local_454) {
      local_4c4 = local_458;
    }
    else {
      local_4c4 = local_454;
    }
    if ((int)local_4c4 < 0) {
      in_stack_fffffffffffffb30 = local_458;
      if ((int)local_454 <= (int)local_458) {
        in_stack_fffffffffffffb30 = local_454;
      }
      in_stack_fffffffffffffb34 = (float)-(int)in_stack_fffffffffffffb30;
    }
    else {
      in_stack_fffffffffffffb34 = local_458;
      if ((int)local_454 <= (int)local_458) {
        in_stack_fffffffffffffb34 = local_454;
      }
    }
    *in_stack_00000040 = in_stack_fffffffffffffb34;
    break;
  case 0x3ea:
    if ((long)local_60 < (long)local_58) {
      local_508 = local_60;
    }
    else {
      local_508 = local_58;
    }
    if ((long)local_508 < 0) {
      in_stack_fffffffffffffae0 = local_60;
      if ((long)local_58 <= (long)local_60) {
        in_stack_fffffffffffffae0 = local_58;
      }
      in_stack_fffffffffffffae8 = (Integer *)-(long)in_stack_fffffffffffffae0;
    }
    else {
      in_stack_fffffffffffffae8 = local_60;
      in_stack_fffffffffffffaf0 = local_60;
      if ((long)local_58 <= (long)local_60) {
        in_stack_fffffffffffffae8 = local_58;
        in_stack_fffffffffffffaf0 = local_58;
      }
    }
    *(Integer **)in_stack_00000040 = in_stack_fffffffffffffae8;
    break;
  case 0x3eb:
    in_stack_fffffffffffffb0c = local_460;
    if (local_45c <= local_460) {
      in_stack_fffffffffffffb0c = local_45c;
    }
    if (in_stack_fffffffffffffb0c < 0.0) {
      in_stack_fffffffffffffb00 = local_460;
      if (local_45c <= local_460) {
        in_stack_fffffffffffffb00 = local_45c;
      }
      in_stack_fffffffffffffb04 = -in_stack_fffffffffffffb00;
    }
    else {
      in_stack_fffffffffffffb04 = local_460;
      in_stack_fffffffffffffb08 = local_460;
      if (local_45c <= local_460) {
        in_stack_fffffffffffffb04 = local_45c;
        in_stack_fffffffffffffb08 = local_45c;
      }
    }
    *in_stack_00000040 = in_stack_fffffffffffffb04;
    break;
  case 0x3ec:
    if ((double)local_50 < (double)local_48) {
      local_4d8 = local_50;
    }
    else {
      local_4d8 = local_48;
    }
    if ((double)local_4d8 < 0.0) {
      in_stack_fffffffffffffb10 = local_50;
      if ((double)local_48 <= (double)local_50) {
        in_stack_fffffffffffffb10 = local_48;
      }
      local_4e8 = (Integer *)((ulong)in_stack_fffffffffffffb10 ^ 0x8000000000000000);
    }
    else {
      if ((double)local_50 < (double)local_48) {
        local_4e0 = local_50;
      }
      else {
        local_4e0 = local_48;
      }
      local_4e8 = local_4e0;
    }
    *(Integer **)in_stack_00000040 = local_4e8;
    break;
  default:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    break;
  case 0x3ee:
  case 0x3ef:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_elem_minimum(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  pnga_elem_multiply(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  pnga_copy(unaff_RBX,in_RDI);
  pnga_abs_value(CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  pIVar9 = pIVar8;
  pnga_add_patch(in_stack_00000818,in_stack_00000810,in_stack_00000808,in_stack_00000800,
                 in_stack_000007f8,in_stack_000007f0,in_stack_00000830,in_stack_00000838,
                 in_stack_00000840,in_stack_00000848,in_stack_00000850);
  pnga_step_mask_patch
            ((Integer)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
             in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,pIVar8,
             CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
             (Integer *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             in_stack_fffffffffffffb10);
  pnga_select_elem((Integer)in_RSI,(char *)pIVar9,in_RCX,in_R8);
  switch(local_a0) {
  case 0x3e9:
    *in_stack_00000038 = local_454;
    break;
  case 0x3ea:
    *(Integer **)in_stack_00000038 = local_58;
    break;
  case 0x3eb:
    *in_stack_00000038 = local_45c;
    break;
  case 0x3ec:
    *(Integer **)in_stack_00000038 = local_48;
    break;
  default:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    break;
  case 0x3ee:
  case 0x3ef:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_select_elem((Integer)in_RSI,(char *)pIVar9,in_RCX,in_R8);
  switch(local_a0) {
  case 0x3e9:
    *in_stack_00000048 = local_454;
    break;
  case 0x3ea:
    *(Integer **)in_stack_00000048 = local_58;
    break;
  case 0x3eb:
    *in_stack_00000048 = local_45c;
    break;
  case 0x3ec:
    *(Integer **)in_stack_00000048 = local_48;
    break;
  default:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    break;
  case 0x3ee:
  case 0x3ef:
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_destroy((Integer)pIVar8);
  pnga_destroy((Integer)pIVar8);
  pnga_destroy((Integer)pIVar8);
  pnga_destroy((Integer)pIVar8);
  if (iVar5 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_step_bound_info_patch(
     Integer g_xx, Integer *xxlo, Integer *xxhi,    /* patch of g_xx */
     Integer g_vv, Integer *vvlo, Integer *vvhi,    /* patch of g_vv */
     Integer g_xxll, Integer *xxlllo, Integer *xxllhi,    /* patch of g_xxll */
     Integer g_xxuu, Integer *xxuulo, Integer *xxuuhi,    /* patch of g_xxuu */
     void *boundmin, void* wolfemin, void *boundmax)
{
     /*double  result1,result2;*/
     double  dresult,dresult2;
     long    lresult,lresult2;

     Integer index[MAXDIM];
     Integer xxtype;
     Integer xxndim, xxdims[MAXDIM];
     Integer loXX[MAXDIM], hiXX[MAXDIM];
     Integer vvtype;
     Integer vvndim, vvdims[MAXDIM];
     Integer loVV[MAXDIM], hiVV[MAXDIM];
     Integer xxtotal,vvtotal;
     Integer xltype;
     Integer xlndim, xldims[MAXDIM];
     Integer loXL[MAXDIM], hiXL[MAXDIM];
     Integer xutype;
     Integer xundim, xudims[MAXDIM];
     Integer loXU[MAXDIM], hiXU[MAXDIM];
     Integer xltotal,xutotal;
     Integer me= pnga_nodeid();
     Integer g_Q;
     Integer g_R;
     Integer g_S;
     Integer g_T;
     double dalpha = (double)1.0, dbeta = (double)(-1.0);
     long   lalpha = (long)1, lbeta = (long)(-1);
     int ialpha = (int)1, ibeta = (int)(-1);
     float   falpha = (float)1.0, fbeta = (float)(-1.0);
     int iresult,iresult2;
     float   fresult,fresult2;
     Integer compatible;
     Integer compatible2;
     Integer compatible3;
     void *sresult = NULL;
     void *sresult2 = NULL;
     void *alpha = NULL,*beta = NULL;
     int local_sync_begin,local_sync_end;
     int i;

     local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
     _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
     if(local_sync_begin)pnga_sync();

     /* Check for valid ga handles. */

     pnga_check_handle(g_xx, "pnga_step_bound_info_patch");
     pnga_check_handle(g_vv, "pnga_step_bound_info_patch");
     pnga_check_handle(g_xxll, "pnga_step_bound_info_patch");
     pnga_check_handle(g_xxuu, "pnga_step_bound_info_patch");


     /* get chaacteristics of the input ga patches */

     pnga_inquire(g_xx, &xxtype, &xxndim, xxdims);
     pnga_inquire(g_vv, &vvtype, &vvndim, vvdims);
     pnga_inquire(g_xxll, &xltype, &xlndim, xldims);
     pnga_inquire(g_xxuu, &xutype, &xundim, xudims);

     /* Check for matching types. */

     if(xxtype != vvtype) pnga_error(" pnga_step_bound_info_patch: types mismatch ", 0L); 
     if(xxtype != xltype) pnga_error(" pnga_step_bound_info_patch: types mismatch ", 0L); 
     if(xxtype != xutype) pnga_error(" pnga_step_bound_info_patch: types mismatch ", 0L); 

     /* check if patch indices and dims match */
     for(i=0; i<xxndim; i++)
       if(xxlo[i] <= 0 || xxhi[i] > xxdims[i])
	 pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ", g_xx);

     for(i=0; i<vvndim; i++)
       if(vvlo[i] <= 0 || vvhi[i] > vvdims[i])
	 pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ", g_vv);

     for(i=0; i<xlndim; i++)
       if(xxlllo[i] <= 0 || xxllhi[i] > xldims[i])
	 pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ", g_xxll);
     for(i=0; i<xundim; i++)
       if(xxuulo[i] <= 0 || xxuuhi[i] > xudims[i])
	 pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ", g_xxuu);
     
     /* check if numbers of elements in patches match each other */
     xxtotal = 1; for(i=0; i<xxndim; i++) xxtotal *= (xxhi[i] - xxlo[i] + 1);
     vvtotal = 1; for(i=0; i<vvndim; i++) vvtotal *= (vvhi[i] - vvlo[i] + 1);
     xltotal = 1; for(i=0; i<xlndim; i++) xltotal *= (xxllhi[i] - xxlllo[i] + 1);
     xutotal = 1; for(i=0; i<xundim; i++) xutotal *= (xxuuhi[i] - xxuulo[i] + 1);
 
     if(xxtotal != vvtotal)
        pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ", 0L);
     if(xxtotal != xltotal)
        pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ", 0L);
     if(xxtotal != xutotal)
        pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ", 0L);
     /* find out coordinates of patches of g_a, and g_b that I own */
     pnga_distribution(g_xx, me, loXX, hiXX);
     pnga_distribution(g_vv, me, loVV, hiVV);
     pnga_distribution(g_xxll, me, loXL, hiXL);
     pnga_distribution(g_xxuu, me, loXU, hiXU);
     

     /* test if the local portion of patches matches */
     if(pnga_comp_patch(xxndim, loXX, hiXX, vvndim, loVV, hiVV) &&
	pnga_comp_patch(xxndim, xxlo, xxhi, vvndim, vvlo, vvhi)) {
       compatible = 1;
     }
     else {
       compatible = 0;
     }
     if(pnga_comp_patch(xxndim, loXX, hiXX, xlndim, loXL, hiXL) &&
	pnga_comp_patch(xxndim, xxlo, xxhi, xlndim, xxlllo, xxllhi)) {
       compatible2 = 1;
     }
     else {
       compatible2 = 0;
     }
     if(pnga_comp_patch(xxndim, loXX, hiXX, xundim, loXU, hiXU) &&
	pnga_comp_patch(xxndim, xxlo, xxhi, xundim, xxuulo, xxuuhi)) {
       compatible3 = 1;
     }
     else {
       compatible3 = 0;
     }
     compatible = compatible * compatible2 * compatible3;
     /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
     pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
     if(!compatible) {
       pnga_error(" pnga_step_bound_info_patch mismatched patchs ",0);
     }
     switch (xxtype)
       {
       case C_INT:
	 /* This should point to iresult but we use lresult
	    due to the strange implementation if pnga_select_elem.
	 */
	 sresult = &iresult;
	 sresult2 = &iresult2;
	 alpha    = &ialpha;
	 beta     = &ibeta;
	 break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 sresult = &dresult;
	 sresult2 = &dresult2;
	 alpha    = &dalpha;
	 beta     = &dbeta;
	 break;
       case C_FLOAT:
	 sresult = &fresult;
	 sresult2 = &fresult2;
	 alpha    = &falpha;
	 beta     = &fbeta;
	 break;
       case C_LONG:
	 sresult = &lresult;
	 sresult2 = &lresult2;
	 alpha    = &lalpha;
	 beta     = &lbeta;
	 break;
       default:
	 pnga_error("Ga_step_max_patch_: alpha/beta set wrong data type.", xxtype);
       }

     /*duplicatecate an array Q to hold the temparary result */
     pnga_duplicate(g_xx, &g_Q, "TempQ");
     if(g_Q==0)
       pnga_error("pnga_step_bound_info_patch:fail to duplicate array Q", g_Q);
     
     /*duplicatecate an array R to hold the temparary result */
     pnga_duplicate(g_xx, &g_R, "TempR");
     if(g_R==0)
       pnga_error("pnga_step_bound_info_patch:fail to duplicate array R", g_R);

     /*duplicatecate an array s to hold the temparary result */
     pnga_duplicate(g_xx, &g_S, "TempS");
     if(g_S==0)
       pnga_error("pnga_step_bound_info_patch:fail to duplicate array S", g_S);
     
     /*duplicatecate an array T to hold the temparary result */
     pnga_duplicate(g_xx, &g_T, "TempT");
     if(g_T==0)
       pnga_error("pnga_step_bound_info_patch:fail to duplicate array T", g_T);

     /*First, compute xu - xx */
     pnga_add_patch(alpha, g_xxuu, xxuulo, xxuuhi, beta, g_xx, xxlo, xxhi, g_S, xxlo, xxhi); 

     /*Check for negative elements in g_s, if it has any then xxuu was
       not an upper bound, exit with error message.
     */
     if(has_negative_elem(g_S, xxlo, xxhi) == 1)
       pnga_error("pnga_step_bound_info_patch: Upper bound is not > xx.", -1);

     /* Then compute t = positve elements of vv */
     pnga_zero(g_T);
     pnga_elem_maximum(g_vv,g_T,g_T);

     /* Then, compute (xu-xx)/vv */
     pnga_elem_stepb_divide_patch(g_S, xxlo, xxhi, g_T, vvlo, vvhi, g_T, xxlo, xxhi); 

     /* Then, we will select the minimum of the array g_t*/ 
     pnga_select_elem(g_T, "min", sresult, &index[0]); 

     switch (xxtype)
       {
       case C_INT:
	 /* This should be iresult but is lresult because of
	    the strange implementation of nga_select_elem.
	 */
           /* result1 = (double)(iresult); */
           break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 /* result1 = dresult; */
	 break;
       case C_FLOAT:
	 /* result1 = (double)fresult; */
	 break;
       case C_LONG:
	 /* result1 = (double)lresult; */
	 break;
       default:
	 pnga_error("Ga_step_bound_info_patch_: result set: wrong data type.", xxtype);
       }

     /*Now doing the same thing to get (xx-xxll)/dv */
     /*First, compute xl - xx */
     pnga_add_patch(alpha, g_xx, xxlo, xxhi, beta, g_xxll, xxlllo, xxllhi, g_Q, xxlo, xxhi); 
     /*Check for negative elements in g_s, if it has any then xxll was
       not a lower bound, exit with error message.
     */
     if(has_negative_elem(g_Q, xxlo, xxhi) == 1)
       pnga_error("pnga_step_bound_info_patch: Lower bound is not < xx.", -1);

     /* Then compute r = negative elements of vv */
     pnga_zero(g_R);
     pnga_elem_minimum(g_vv,g_R,g_R);
     pnga_abs_value(g_R);

     /* Then, compute (xx-xl)/vv */
     pnga_elem_stepb_divide_patch(g_Q, xxlo, xxhi, g_R, vvlo, vvhi, g_R, xxlo, xxhi); 
     /* Then, we will select the minimum of the array g_t*/ 
     pnga_select_elem(g_R, "min", sresult2, &index[0]); 
     switch (xxtype)
       {
       case C_INT:
	 *(int*)wolfemin = GA_ABS(GA_MIN(iresult,iresult2));
	 break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 *(double*)wolfemin = GA_ABS(GA_MIN(dresult,dresult2));
	 break;
       case C_FLOAT:
	 *(float*)wolfemin = GA_ABS(GA_MIN(fresult,fresult2));
	 break;
       case C_LONG:
	 *(long*)wolfemin =  GA_ABS(GA_MIN(lresult,lresult2));
	 break;
       default:
	 pnga_error("Ga_step_bound_info_patch_: result2 set: wrong data type.", xxtype);
       }
     /* 
       Now set T to be the elementwise minimum of R and T. 
       So, T is infinity only where ever g_vv is zero.
     */
     pnga_elem_minimum(g_R,g_T,g_T);
     /*
       Now we want to set T to be zero whenever g_vv was zero
       and gxx coincides with either boundary vector.
       Set S to be the element-wise product of S and Q.
       It will be zero when either of them is zero.
     */
     pnga_elem_multiply(g_Q,g_S,g_S);
     /*
       Set Q to the |vv|.
     */
     pnga_copy(g_vv,g_Q);
     pnga_abs_value(g_Q);
     /* 
       Now add q and s to get a vector that is zero only
       where g_vv was zero and g_xx meets one of the
       boundary vectors.
     */
     pnga_add_patch(alpha, g_Q, xxlo, xxhi, alpha, g_S, xxlo, xxhi, g_S, xxlo, xxhi); 
     /* 
       Then use that vector as a mask to set certain
       elements of T to be zero (so we have a collection
       of the a_i and c_i elements as per the TAO StepBoundInfo
       function).
     */
     pnga_step_mask_patch(g_S,xxlo,xxhi,g_T,xxlo,xxhi,g_T,xxlo,xxhi);

     /* 
       Then, we will select the minimum of the array g_t, that will
       be boundmin .
     */ 
     pnga_select_elem(g_T, "min", sresult, &index[0]); 
     switch (xxtype)
       {
       case C_INT:
	 /* This should be iresult but is lresult because of
	    the strange implementation of nga_select_elem.
	 */
           *(int*)boundmin = iresult;
           break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 *(double*)boundmin = dresult;
	 break;
       case C_FLOAT:
	 *(float*)boundmin = fresult;
	 break;
       case C_LONG:
	 *(long*)boundmin = lresult;
	 break;
       default:
	 pnga_error("Ga_step_bound_info_patch_: result set: wrong data type.", xxtype);
       }
     /* 
       Then, we will select the maximum of the array g_t, that will
       be boundmax .
     */ 
     pnga_select_elem(g_T, "max", sresult, &index[0]); 
     switch (xxtype)
       {
       case C_INT:
	 /* This should be iresult but is lresult because of
	    the strange implementation of nga_select_elem.
	 */
           *(int*)boundmax = iresult;
           break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 *(double*)boundmax = dresult;
	 break;
       case C_FLOAT:
	 *(float*)boundmax = fresult;
	 break;
       case C_LONG:
	 *(long*)boundmax = lresult;
	 break;
       default:
	 pnga_error("Ga_step_bound_info_patch_: result set: wrong data type.", xxtype);
       }
     pnga_destroy(g_Q); 
     pnga_destroy(g_R); 
     pnga_destroy(g_S); 
     pnga_destroy(g_T); 
     if(local_sync_end)pnga_sync();
}